

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_vector_match(int16_t *ref,int16_t *src,int bwl,int search_size,int full_search,int *sad)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  int16_t *in_RSI;
  long in_RDI;
  int in_R8D;
  int *in_R9;
  int this_pos_3;
  int this_pos_2;
  int this_pos_1;
  int this_pos;
  int bw;
  int offset;
  int center;
  int d;
  int this_sad;
  int best_sad;
  int local_44;
  int local_40;
  int local_3c;
  int local_34;
  int local_4;
  
  local_34 = 0x7fffffff;
  local_44 = 0;
  iVar1 = in_ECX << 1;
  if (in_R8D == 0) {
    for (local_3c = 0; local_3c <= iVar1; local_3c = local_3c + 0x10) {
      iVar2 = (*aom_vector_var)((int16_t *)(in_RDI + (long)local_3c * 2),in_RSI,in_EDX);
      if (iVar2 < local_34) {
        local_44 = local_3c;
        local_34 = iVar2;
      }
    }
    local_40 = local_44;
    for (local_3c = -8; iVar2 = local_40, local_3c < 9; local_3c = local_3c + 0x10) {
      iVar2 = local_44 + local_3c;
      if (((-1 < iVar2) && (iVar2 <= iVar1)) &&
         (iVar3 = (*aom_vector_var)((int16_t *)(in_RDI + (long)iVar2 * 2),in_RSI,in_EDX),
         iVar3 < local_34)) {
        local_40 = iVar2;
        local_34 = iVar3;
      }
    }
    for (local_3c = -4; iVar3 = local_40, local_3c < 5; local_3c = local_3c + 8) {
      iVar3 = iVar2 + local_3c;
      if (((-1 < iVar3) && (iVar3 <= iVar1)) &&
         (iVar4 = (*aom_vector_var)((int16_t *)(in_RDI + (long)iVar3 * 2),in_RSI,in_EDX),
         iVar4 < local_34)) {
        local_40 = iVar3;
        local_34 = iVar4;
      }
    }
    for (local_3c = -2; iVar2 = local_40, local_3c < 3; local_3c = local_3c + 4) {
      iVar2 = iVar3 + local_3c;
      if (((-1 < iVar2) && (iVar2 <= iVar1)) &&
         (iVar4 = (*aom_vector_var)((int16_t *)(in_RDI + (long)iVar2 * 2),in_RSI,in_EDX),
         iVar4 < local_34)) {
        local_40 = iVar2;
        local_34 = iVar4;
      }
    }
    for (local_3c = -1; local_3c < 2; local_3c = local_3c + 2) {
      iVar3 = iVar2 + local_3c;
      if (((-1 < iVar3) && (iVar3 <= iVar1)) &&
         (iVar4 = (*aom_vector_var)((int16_t *)(in_RDI + (long)iVar3 * 2),in_RSI,in_EDX),
         iVar4 < local_34)) {
        local_40 = iVar3;
        local_34 = iVar4;
      }
    }
    *in_R9 = local_34;
    local_4 = local_40 - (iVar1 >> 1);
  }
  else {
    for (local_3c = 0; local_3c <= iVar1; local_3c = local_3c + 1) {
      iVar2 = (*aom_vector_var)((int16_t *)(in_RDI + (long)local_3c * 2),in_RSI,in_EDX);
      if (iVar2 < local_34) {
        local_44 = local_3c;
        local_34 = iVar2;
      }
    }
    *in_R9 = local_34;
    local_4 = local_44 - (iVar1 >> 1);
  }
  return local_4;
}

Assistant:

int av1_vector_match(const int16_t *ref, const int16_t *src, int bwl,
                     int search_size, int full_search, int *sad) {
  int best_sad = INT_MAX;
  int this_sad;
  int d;
  int center, offset = 0;
  int bw = search_size << 1;

  if (full_search) {
    for (d = 0; d <= bw; d++) {
      this_sad = aom_vector_var(&ref[d], src, bwl);
      if (this_sad < best_sad) {
        best_sad = this_sad;
        offset = d;
      }
    }
    center = offset;
    *sad = best_sad;
    return (center - (bw >> 1));
  }

  for (d = 0; d <= bw; d += 16) {
    this_sad = aom_vector_var(&ref[d], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      offset = d;
    }
  }
  center = offset;

  for (d = -8; d <= 8; d += 16) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  offset = center;

  for (d = -4; d <= 4; d += 8) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  offset = center;

  for (d = -2; d <= 2; d += 4) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  offset = center;

  for (d = -1; d <= 1; d += 2) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  *sad = best_sad;
  return (center - (bw >> 1));
}